

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqldatabase.cpp
# Opt level: O0

void __thiscall QSqlDatabasePrivate::QSqlDatabasePrivate(QSqlDatabasePrivate *this,QSqlDriver *dr)

{
  QAtomicInt *in_RSI;
  long in_RDI;
  
  QAtomicInt::QAtomicInt(in_RSI,(int)((ulong)in_RDI >> 0x20));
  *(QAtomicInt **)(in_RDI + 8) = in_RSI;
  QString::QString((QString *)0x11fa8b);
  QString::QString((QString *)0x11fa98);
  QString::QString((QString *)0x11faa5);
  QString::QString((QString *)0x11fab2);
  QString::QString((QString *)0x11fabf);
  *(undefined4 *)(in_RDI + 0x88) = 0xffffffff;
  QString::QString((QString *)0x11fad9);
  QString::QString((QString *)0x11fae9);
  *(undefined4 *)(in_RDI + 0xc0) = 4;
  return;
}

Assistant:

QSqlDatabasePrivate(QSqlDriver *dr):
        ref(1),
        driver(dr),
        port(-1)
    {
        precisionPolicy = QSql::LowPrecisionDouble;
    }